

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall cs::event_type::event_type(event_type *this,listener_type *default_listener)

{
  stack_type<std::function<bool_(void_*)>,_std::allocator>::stack_type(&this->m_listener);
  stack_type<std::function<bool(void*)>,std::allocator>::push<std::function<bool(void*)>>
            ((stack_type<std::function<bool(void*)>,std::allocator> *)this,default_listener);
  return;
}

Assistant:

explicit event_type(listener_type default_listener)
		{
			m_listener.push(std::move(default_listener));
		}